

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_term.c
# Opt level: O0

bool_t cmdTermKbhit(void)

{
  int bytesWaiting;
  termios newattr;
  termios oldattr;
  int local_7c;
  termios local_78;
  termios local_3c;
  
  tcgetattr(0,&local_3c);
  memcpy(&local_78,&local_3c,0x3c);
  local_78.c_lflag = local_78.c_lflag & 0xfffffff5;
  tcsetattr(0,0,&local_78);
  ioctl(0,0x541b,&local_7c);
  tcsetattr(0,0,&local_3c);
  return (bool_t)(0 < local_7c);
}

Assistant:

bool_t cmdTermKbhit()
{
	struct termios oldattr, newattr;
	int bytesWaiting;
	tcgetattr(STDIN_FILENO, &oldattr);
	newattr = oldattr;
	newattr.c_lflag &= ~(ICANON | ECHO);
	tcsetattr(STDIN_FILENO, TCSANOW, &newattr);
	ioctl(STDIN_FILENO, FIONREAD, &bytesWaiting);
	tcsetattr(STDIN_FILENO, TCSANOW, &oldattr);
	return bytesWaiting > 0;
}